

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O2

void __thiscall duckdb::WindowBuilder::Sink(WindowBuilder *this,DataChunk *chunk,idx_t input_idx)

{
  optional_ptr<duckdb::ColumnDataCollection,_true> *this_00;
  ColumnDataCollection *pCVar1;
  reference pvVar2;
  reference this_01;
  ulong uVar3;
  UnifiedVectorFormat data;
  
  this_00 = &(this->sink).second;
  if (((this->sink).second.ptr != (ColumnDataCollection *)0x0) &&
     (uVar3 = (this->sink).first, uVar3 <= input_idx)) {
    pCVar1 = optional_ptr<duckdb::ColumnDataCollection,_true>::operator->(this_00);
    if (input_idx <= uVar3 + pCVar1->count) goto LAB_00a82cec;
  }
  WindowCollection::GetCollection(this->collection,input_idx,&this->sink);
  pCVar1 = optional_ptr<duckdb::ColumnDataCollection,_true>::operator->(this_00);
  ColumnDataCollection::InitializeAppend(pCVar1,&this->appender);
LAB_00a82cec:
  pCVar1 = optional_ptr<duckdb::ColumnDataCollection,_true>::operator->(this_00);
  ColumnDataCollection::Append(pCVar1,&this->appender,chunk);
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar3 = uVar3 + 1) {
    pvVar2 = vector<std::atomic<bool>,_true>::get<true>(&this->collection->all_valids,uVar3);
    if (((pvVar2->_M_base)._M_i & 1U) != 0) {
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      this_01 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar3);
      Vector::ToUnifiedFormat(this_01,chunk->count,&data);
      if (data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        pvVar2 = vector<std::atomic<bool>,_true>::get<true>(&this->collection->all_valids,uVar3);
        LOCK();
        (pvVar2->_M_base)._M_i = false;
        UNLOCK();
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&data);
    }
  }
  return;
}

Assistant:

void WindowBuilder::Sink(DataChunk &chunk, idx_t input_idx) {
	// Check whether we need a a new collection
	if (!sink.second || input_idx < sink.first || sink.first + sink.second->Count() < input_idx) {
		collection.GetCollection(input_idx, sink);
		D_ASSERT(sink.second);
		sink.second->InitializeAppend(appender);
	}
	sink.second->Append(appender, chunk);

	// Record NULLs
	for (column_t col_idx = 0; col_idx < chunk.ColumnCount(); ++col_idx) {
		if (!collection.all_valids[col_idx]) {
			continue;
		}

		// Column was valid, make sure it still is.
		UnifiedVectorFormat data;
		chunk.data[col_idx].ToUnifiedFormat(chunk.size(), data);
		if (!data.validity.AllValid()) {
			collection.all_valids[col_idx] = false;
		}
	}
}